

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O1

int GetRawExpressScanDataResponseRPLIDAR
              (RPLIDAR *pRPLIDAR,uchar *esdataresponse,int nb_bytes_response)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  __time_t _Var4;
  int iVar5;
  long *plVar6;
  size_t __n;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  CHRONO chrono;
  uchar recvbuf [1024];
  timespec local_498;
  uchar *local_488;
  timespec local_480;
  undefined8 local_470;
  undefined8 uStack_468;
  long local_460;
  long lStack_458;
  timespec local_450;
  int local_440;
  byte local_438 [1032];
  
  iVar1 = clock_getres(4,&local_450);
  if ((iVar1 == 0) && (iVar1 = clock_gettime(4,&local_480), iVar1 == 0)) {
    local_440 = 0;
    local_470 = 0;
    uStack_468 = 0;
    local_460 = 0;
    lStack_458 = 0;
  }
  memset(local_438,0,0x400);
  iVar1 = (pRPLIDAR->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    if (0 < nb_bytes_response) {
      iVar1 = (pRPLIDAR->RS232Port).s;
      uVar9 = 0;
      do {
        sVar3 = recv(iVar1,local_438 + uVar9,(long)(nb_bytes_response - (int)uVar9),0);
        if ((int)sVar3 < 1) goto LAB_001ab714;
        uVar7 = (int)uVar9 + (int)sVar3;
        uVar9 = (ulong)uVar7;
      } while ((int)uVar7 < nb_bytes_response);
    }
  }
  else {
    if (iVar1 != 0) {
LAB_001ab714:
      puts("Error reading data from a RPLIDAR. ");
      return 1;
    }
    if (nb_bytes_response != 0) {
      iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
      uVar9 = 0;
      do {
        sVar3 = read(iVar1,local_438 + uVar9,(ulong)(uint)(nb_bytes_response - (int)uVar9));
        if ((int)sVar3 < 1) goto LAB_001ab714;
        uVar7 = (int)uVar9 + (int)sVar3;
        uVar9 = (ulong)uVar7;
      } while (uVar7 < (uint)nb_bytes_response);
    }
  }
  local_488 = esdataresponse;
  iVar1 = nb_bytes_response;
  do {
    uVar7 = 0;
    pbVar12 = local_438;
    do {
      uVar10 = nb_bytes_response - (iVar1 - uVar7);
      if (uVar10 == 0 || nb_bytes_response < (int)(iVar1 - uVar7)) {
        if ((byte)(pbVar12[1] >> 4 | *pbVar12 & 0xf0) == 0xa5) {
          uVar2 = 0;
          bVar8 = 0;
          if (2 < nb_bytes_response) {
            uVar9 = 0;
            bVar8 = 0;
            do {
              bVar8 = bVar8 ^ pbVar12[uVar9 + 2];
              uVar9 = uVar9 + 1;
            } while (nb_bytes_response - 2 != uVar9);
          }
          uVar10 = 0xffffffff;
          if ((byte)(*pbVar12 & 0xf | pbVar12[1] << 4) == bVar8) {
            iVar5 = 0;
            goto LAB_001ab50e;
          }
          puts("Warning : RPLIDAR bad ChkSum. ");
        }
        else {
          puts("Warning : RPLIDAR bad sync1 or sync2. ");
        }
        uVar2 = 1;
        uVar10 = 0xffffffff;
        iVar5 = 1;
      }
      else {
        iVar5 = 6;
        uVar2 = 0;
      }
LAB_001ab50e:
      uVar11 = 0xffffffff;
      if ((iVar5 == 0) || (uVar11 = uVar10, iVar5 == 6)) goto LAB_001ab537;
      pbVar12 = pbVar12 + uVar2;
      uVar7 = uVar7 + uVar2;
    } while ((int)uVar7 < iVar1);
    iVar5 = 1;
    uVar11 = 0xffffffff;
LAB_001ab537:
    if (iVar5 == 1) {
      uVar11 = nb_bytes_response;
      if ((int)uVar7 < nb_bytes_response) {
        uVar11 = uVar7;
      }
    }
    else if (iVar5 == 0) {
      if (0 < (int)(iVar1 - (uVar7 + nb_bytes_response))) {
        puts("Warning getting data from a RPLIDAR : Unexpected data after a data response. ");
      }
      memcpy(local_488,local_438,(long)nb_bytes_response);
      return 0;
    }
    __n = (size_t)(int)(iVar1 - uVar7);
    memmove(local_438,local_438 + (int)uVar7,__n);
    iVar1 = (iVar1 - uVar7) + uVar11;
    if (0x3ff < iVar1) {
      puts("Error reading data from a RPLIDAR : Invalid data. ");
      return 4;
    }
    iVar5 = (pRPLIDAR->RS232Port).DevType;
    if (iVar5 - 1U < 4) {
      if (0 < (int)uVar11) {
        iVar5 = (pRPLIDAR->RS232Port).s;
        uVar7 = 0;
        do {
          sVar3 = recv(iVar5,local_438 + uVar7 + __n,(long)(int)(uVar11 - uVar7),0);
          if ((int)sVar3 < 1) goto LAB_001ab714;
          uVar7 = uVar7 + (int)sVar3;
        } while ((int)uVar7 < (int)uVar11);
      }
    }
    else {
      if (iVar5 != 0) goto LAB_001ab714;
      if (uVar11 != 0) {
        iVar5 = *(int *)&(pRPLIDAR->RS232Port).hDev;
        uVar7 = 0;
        do {
          sVar3 = read(iVar5,local_438 + uVar7 + __n,(ulong)(uVar11 - uVar7));
          if ((int)sVar3 < 1) goto LAB_001ab714;
          uVar7 = uVar7 + (int)sVar3;
        } while (uVar7 < uVar11);
      }
    }
    if (local_440 == 0) {
      clock_gettime(4,&local_498);
      local_498.tv_sec =
           (local_498.tv_sec + local_460 + (local_498.tv_nsec + lStack_458) / 1000000000) -
           local_480.tv_sec;
      local_498.tv_nsec = (local_498.tv_nsec + lStack_458) % 1000000000 - local_480.tv_nsec;
      if (local_498.tv_nsec < 0) {
        local_498.tv_sec = local_498.tv_sec + local_498.tv_nsec / 1000000000 + -1;
        local_498.tv_nsec = local_498.tv_nsec % 1000000000 + 1000000000;
      }
      plVar6 = &local_498.tv_nsec;
      _Var4 = local_498.tv_sec;
    }
    else {
      plVar6 = &lStack_458;
      _Var4 = local_460;
    }
    if (4.0 < (double)*plVar6 / 1000000000.0 + (double)_Var4) {
      puts("Error reading data from a RPLIDAR : Data response timeout. ");
      return 2;
    }
  } while( true );
}

Assistant:

inline int GetRawExpressScanDataResponseRPLIDAR(RPLIDAR* pRPLIDAR, unsigned char* esdataresponse, int nb_bytes_response)
{
	unsigned char recvbuf[MAX_NB_BYTES_RPLIDAR];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_RPLIDAR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired data response...

	nbBytesToRequest = nb_bytes_response;
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;

	for (;;)
	{
		res = FindExpressScanDataResponseRPLIDAR(recvbuf, BytesReceived, nb_bytes_response, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(nb_bytes_response, nbBytesDiscarded);
		}
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a RPLIDAR : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RPLIDAR. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RPLIDAR)
		{
			printf("Error reading data from a RPLIDAR : Data response timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-nb_bytes_response > 0)
	{
		printf("Warning getting data from a RPLIDAR : Unexpected data after a data response. \n");
	}

	// Store the data...
	memcpy(esdataresponse, recvbuf, nb_bytes_response);

	return EXIT_SUCCESS;
}